

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

floatx80 floatx80_sqrt_mips64(floatx80 a,float_status *status)

{
  undefined1 auVar1 [12];
  ushort uVar2;
  long lVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong b;
  ulong uVar13;
  byte bVar14;
  uint aExp;
  uint64_t uVar15;
  bool bVar16;
  bool bVar17;
  floatx80 fVar18;
  floatx80 fVar19;
  uint64_t term1;
  ulong local_48;
  uint64_t local_40;
  uint64_t term0;
  
  uVar7 = a._8_8_;
  uVar6 = a.low;
  uVar2 = a.high;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 || (long)uVar6 < 0)
  {
    if ((uVar2 & 0x7fff) == 0x7fff) {
      if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) {
        auVar1 = a._0_12_;
        fVar18._12_4_ = 0;
        fVar18.low = auVar1._0_8_;
        fVar18.high = auVar1._8_2_;
        fVar18._10_2_ = auVar1._10_2_;
        fVar18 = propagateFloatx80NaN_mips64(a,fVar18,status);
        auVar1 = fVar18._0_12_;
LAB_0079d138:
        uVar6 = auVar1._0_8_;
        uVar7 = (ulong)auVar1._8_4_;
        goto LAB_0079d13d;
      }
      uVar7 = CONCAT62(a._10_6_,0x7fff);
      if (-1 < (short)uVar2) goto LAB_0079d13d;
    }
    else {
      if (-1 < (short)uVar2) {
        if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
          if (uVar6 == 0) {
            uVar6 = 0;
            uVar7 = 0;
            goto LAB_0079d13d;
          }
          uVar7 = 0x3f;
          if (uVar6 != 0) {
            for (; uVar6 >> uVar7 == 0; uVar7 = uVar7 - 1) {
            }
          }
          uVar6 = uVar6 << ((byte)(uVar7 ^ 0x3f) & 0x3f);
          aExp = 1 - (int)(uVar7 ^ 0x3f);
        }
        else {
          aExp = (uint)(uVar2 & 0x7fff);
        }
        uVar4 = estimateSqrt32(aExp,(uint32_t)(uVar6 >> 0x20));
        bVar14 = (byte)aExp & 1 | 2;
        uVar11 = uVar6 >> bVar14;
        uVar6 = uVar6 << (-bVar14 & 0x3f);
        uVar5 = estimateDiv128To64(uVar11,uVar6,(ulong)uVar4 << 0x20);
        lVar8 = (ulong)uVar4 * 0x40000000;
        uVar15 = uVar5 + lVar8;
        mul64To128(uVar15,uVar15,&term0,&term1);
        uVar7 = uVar6 - term1;
        lVar8 = (uVar5 - 1) + lVar8;
        uVar15 = uVar15 * 2;
        for (lVar12 = (uVar11 - term0) - (ulong)(uVar6 < term1); lVar12 < 0;
            lVar12 = (lVar12 - lVar3) + (ulong)bVar16) {
          lVar3 = lVar8 >> 0x3f;
          bVar16 = CARRY8(uVar7,uVar15 - 1);
          uVar7 = uVar7 + (uVar15 - 1);
          lVar8 = lVar8 + -1;
          uVar15 = uVar15 - 2;
        }
        uVar5 = estimateDiv128To64(uVar7,0,uVar15);
        if ((uVar5 & 0x3ffffffffffffffe) < 6) {
          b = uVar5 + (uVar5 == 0);
          mul64To128(uVar15,b,&term1,&local_48);
          bVar16 = local_48 != 0;
          uVar11 = -local_48;
          mul64To128(b,b,&local_48,&local_40);
          uVar9 = uVar11 - local_48;
          uVar13 = -local_40;
          uVar10 = uVar9 - (local_40 != 0);
          uVar6 = b * 2 - 1;
          uVar5 = b;
          for (lVar8 = (((uVar7 - term1) - (ulong)bVar16) - (ulong)(uVar11 < local_48)) -
                       (ulong)(uVar9 < (local_40 != 0)); uVar5 = uVar5 - 1, lVar8 < 0;
              lVar8 = lVar8 + (ulong)bVar16 + (ulong)(uVar10 < bVar17)) {
            bVar16 = -((long)uVar5 >> 0x3f) + uVar10 + uVar15 < uVar10;
            uVar10 = -((long)uVar5 >> 0x3f) + uVar10 + (ulong)CARRY8(uVar6,uVar13) + uVar15;
            bVar17 = CARRY8(uVar13,uVar6);
            uVar13 = uVar13 + uVar6;
            b = b - 1;
            uVar6 = uVar6 - 2;
          }
          uVar5 = b | ((uVar10 != 0 || lVar8 != 0) || uVar13 != 0);
        }
        fVar18 = roundAndPackFloatx80_mips64
                           (status->floatx80_rounding_precision,'\0',
                            ((int)(aExp - 0x3fff) >> 1) + 0x3fff,uVar15 - ((long)uVar5 >> 0x3f),
                            uVar5 * 2,status);
        auVar1 = fVar18._0_12_;
        goto LAB_0079d138;
      }
      if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 && uVar6 == 0)
      goto LAB_0079d13d;
    }
  }
  uVar6 = 0xc000000000000000;
  status->float_exception_flags = status->float_exception_flags | 1;
  floatx80_default_nan_mips64(status);
  uVar7 = CONCAT62((int6)(uVar7 >> 0x10),0xffff);
LAB_0079d13d:
  fVar19._8_8_ = uVar7 & 0xffffffff;
  fVar19.low = uVar6;
  return fVar19;
}

Assistant:

floatx80 floatx80_sqrt(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp, zExp;
    uint64_t aSig0, aSig1, zSig0, zSig1, doubleZSig0;
    uint64_t rem0, rem1, rem2, rem3, term0, term1, term2, term3;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    aSig0 = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    if ( aExp == 0x7FFF ) {
        if ((uint64_t)(aSig0 << 1)) {
            return propagateFloatx80NaN(a, a, status);
        }
        if ( ! aSign ) return a;
        goto invalid;
    }
    if ( aSign ) {
        if ( ( aExp | aSig0 ) == 0 ) return a;
 invalid:
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    if ( aExp == 0 ) {
        if ( aSig0 == 0 ) return packFloatx80( 0, 0, 0 );
        normalizeFloatx80Subnormal( aSig0, &aExp, &aSig0 );
    }
    zExp = ( ( aExp - 0x3FFF )>>1 ) + 0x3FFF;
    zSig0 = estimateSqrt32( aExp, aSig0>>32 );
    shift128Right( aSig0, 0, 2 + ( aExp & 1 ), &aSig0, &aSig1 );
    zSig0 = estimateDiv128To64( aSig0, aSig1, zSig0<<32 ) + ( zSig0<<30 );
    doubleZSig0 = zSig0<<1;
    mul64To128( zSig0, zSig0, &term0, &term1 );
    sub128( aSig0, aSig1, term0, term1, &rem0, &rem1 );
    while ( (int64_t) rem0 < 0 ) {
        --zSig0;
        doubleZSig0 -= 2;
        add128( rem0, rem1, zSig0>>63, doubleZSig0 | 1, &rem0, &rem1 );
    }
    zSig1 = estimateDiv128To64( rem1, 0, doubleZSig0 );
    if ( ( zSig1 & UINT64_C(0x3FFFFFFFFFFFFFFF) ) <= 5 ) {
        if ( zSig1 == 0 ) zSig1 = 1;
        mul64To128( doubleZSig0, zSig1, &term1, &term2 );
        sub128( rem1, 0, term1, term2, &rem1, &rem2 );
        mul64To128( zSig1, zSig1, &term2, &term3 );
        sub192( rem1, rem2, 0, 0, term2, term3, &rem1, &rem2, &rem3 );
        while ( (int64_t) rem1 < 0 ) {
            --zSig1;
            shortShift128Left( 0, zSig1, 1, &term2, &term3 );
            term3 |= 1;
            term2 |= doubleZSig0;
            add192( rem1, rem2, rem3, 0, term2, term3, &rem1, &rem2, &rem3 );
        }
        zSig1 |= ( ( rem1 | rem2 | rem3 ) != 0 );
    }
    shortShift128Left( 0, zSig1, 1, &zSig0, &zSig1 );
    zSig0 |= doubleZSig0;
    return roundAndPackFloatx80(status->floatx80_rounding_precision,
                                0, zExp, zSig0, zSig1, status);
}